

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

string * testing::internal::edit_distance::CreateUnifiedDiff
                   (string *__return_storage_ptr__,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *left,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *right,size_t context)

{
  pointer pEVar1;
  EditType EVar2;
  char edit;
  ulong uVar3;
  ostream *poVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  _List_node_base *p_Var9;
  size_t sVar10;
  bool bVar11;
  ulong local_268;
  long local_260;
  Hunk hunk;
  vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
  edits;
  stringstream ss;
  ostream local_1a8 [376];
  
  CalculateOptimalEdits(&edits,left,right);
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  local_268 = 0;
  uVar8 = 0;
  local_260 = 0;
  do {
    uVar6 = (long)edits.
                  super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)edits.
                  super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 2;
    if (uVar6 <= uVar8) {
LAB_001095c6:
      std::__cxx11::stringbuf::str();
      std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
      std::
      _Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
      ::~_Vector_base(&edits.
                       super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                     );
      return __return_storage_ptr__;
    }
    lVar7 = local_268 << 5;
    uVar3 = local_268;
    for (lVar5 = 0; uVar6 - uVar8 != lVar5; lVar5 = lVar5 + 1) {
      if (edits.
          super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar8 + lVar5] != kMatch) {
        uVar6 = uVar8 + lVar5;
        break;
      }
      uVar3 = uVar3 + 1;
      lVar7 = lVar7 + 0x20;
    }
    uVar8 = uVar6;
    local_268 = local_268 + lVar5;
    sVar10 = context;
    if (local_268 < context) {
      sVar10 = local_268;
    }
    if (context < uVar3) {
      uVar3 = context;
    }
    hunk.left_start_ = local_268 + (1 - uVar3);
    local_260 = local_260 + lVar5;
    hunk.right_start_ = (1 - uVar3) + local_260;
    hunk.adds_ = 0;
    hunk.removes_ = 0;
    hunk.common_ = 0;
    hunk.hunk_.
    super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
    ._M_impl._M_node._M_size = 0;
    hunk.hunk_adds_.
    super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&hunk.hunk_adds_;
    hunk.hunk_adds_.
    super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
    ._M_impl._M_node._M_size = 0;
    hunk.hunk_removes_.
    super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&hunk.hunk_removes_;
    hunk.hunk_removes_.
    super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
    ._M_impl._M_node._M_size = 0;
    lVar7 = lVar7 + uVar3 * -0x20;
    hunk.hunk_.
    super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&hunk.hunk_;
    hunk.hunk_.
    super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&hunk.hunk_;
    hunk.hunk_adds_.
    super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev =
         hunk.hunk_adds_.
         super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
         ._M_impl._M_node.super__List_node_base._M_next;
    hunk.hunk_removes_.
    super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev =
         hunk.hunk_removes_.
         super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
         ._M_impl._M_node.super__List_node_base._M_next;
    while (bVar11 = sVar10 != 0, sVar10 = sVar10 - 1, bVar11) {
      anon_unknown_1::Hunk::PushLine
                (&hunk,' ',
                 *(char **)((long)&(((left->
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p
                           + lVar7));
      lVar7 = lVar7 + 0x20;
    }
    lVar5 = uVar8 * 4;
    uVar6 = 0;
    while( true ) {
      if ((ulong)((long)edits.
                        super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)edits.
                        super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 2) <= uVar8) break;
      lVar7 = lVar5;
      if (context <= uVar6) {
        while( true ) {
          pEVar1 = (pointer)((long)edits.
                                   super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                                   ._M_impl.super__Vector_impl_data._M_start + lVar7);
          if (pEVar1 == edits.
                        super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                        ._M_impl.super__Vector_impl_data._M_finish) goto LAB_00109481;
          if (*pEVar1 != kMatch) break;
          lVar7 = lVar7 + 4;
        }
        if ((pEVar1 == edits.
                       super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                       ._M_impl.super__Vector_impl_data._M_finish) ||
           (context <= (lVar7 >> 2) - uVar8)) break;
      }
      EVar2 = edits.
              super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar8];
      uVar6 = uVar6 + 1;
      if (EVar2 != kMatch) {
        uVar6 = 0;
      }
      if ((EVar2 < 4) && (EVar2 != kAdd)) {
        edit = '-';
        if (EVar2 == kMatch) {
          edit = ' ';
        }
        anon_unknown_1::Hunk::PushLine
                  (&hunk,edit,
                   (left->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start[local_268]._M_dataplus._M_p);
      }
      if ((EVar2 & ~kRemove) == kAdd) {
        anon_unknown_1::Hunk::PushLine
                  (&hunk,'+',
                   (right->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start[local_260]._M_dataplus._M_p);
      }
      local_268 = local_268 + (EVar2 != kAdd);
      local_260 = local_260 + (ulong)(EVar2 != kRemove);
      uVar8 = uVar8 + 1;
      lVar5 = lVar5 + 4;
    }
LAB_00109481:
    if (hunk.removes_ == 0 && hunk.adds_ == 0) {
      anon_unknown_1::Hunk::~Hunk(&hunk);
      goto LAB_001095c6;
    }
    std::operator<<(local_1a8,"@@ ");
    if (hunk.removes_ != 0) {
      poVar4 = std::operator<<(local_1a8,"-");
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      poVar4 = std::operator<<(poVar4,",");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      if (hunk.adds_ != 0 && hunk.removes_ != 0) {
        std::operator<<(local_1a8," ");
      }
    }
    if (hunk.adds_ != 0) {
      poVar4 = std::operator<<(local_1a8,"+");
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      poVar4 = std::operator<<(poVar4,",");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    }
    std::operator<<(local_1a8," @@\n");
    anon_unknown_1::Hunk::FlushEdits(&hunk);
    p_Var9 = (_List_node_base *)&hunk.hunk_;
    while (p_Var9 = (((_List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
                       *)&p_Var9->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var9 != (_List_node_base *)&hunk.hunk_) {
      poVar4 = std::operator<<(local_1a8,*(char *)&p_Var9[1]._M_next);
      poVar4 = std::operator<<(poVar4,(char *)p_Var9[1]._M_prev);
      std::operator<<(poVar4,"\n");
    }
    anon_unknown_1::Hunk::~Hunk(&hunk);
  } while( true );
}

Assistant:

std::string CreateUnifiedDiff(const std::vector<std::string>& left,
                              const std::vector<std::string>& right,
                              size_t context) {
  const std::vector<EditType> edits = CalculateOptimalEdits(left, right);

  size_t l_i = 0, r_i = 0, edit_i = 0;
  std::stringstream ss;
  while (edit_i < edits.size()) {
    // Find first edit.
    while (edit_i < edits.size() && edits[edit_i] == kMatch) {
      ++l_i;
      ++r_i;
      ++edit_i;
    }

    // Find the first line to include in the hunk.
    const size_t prefix_context = std::min(l_i, context);
    Hunk hunk(l_i - prefix_context + 1, r_i - prefix_context + 1);
    for (size_t i = prefix_context; i > 0; --i) {
      hunk.PushLine(' ', left[l_i - i].c_str());
    }

    // Iterate the edits until we found enough suffix for the hunk or the input
    // is over.
    size_t n_suffix = 0;
    for (; edit_i < edits.size(); ++edit_i) {
      if (n_suffix >= context) {
        // Continue only if the next hunk is very close.
        std::vector<EditType>::const_iterator it = edits.begin() + edit_i;
        while (it != edits.end() && *it == kMatch) ++it;
        if (it == edits.end() || (it - edits.begin()) - edit_i >= context) {
          // There is no next edit or it is too far away.
          break;
        }
      }

      EditType edit = edits[edit_i];
      // Reset count when a non match is found.
      n_suffix = edit == kMatch ? n_suffix + 1 : 0;

      if (edit == kMatch || edit == kRemove || edit == kReplace) {
        hunk.PushLine(edit == kMatch ? ' ' : '-', left[l_i].c_str());
      }
      if (edit == kAdd || edit == kReplace) {
        hunk.PushLine('+', right[r_i].c_str());
      }

      // Advance indices, depending on edit type.
      l_i += edit != kAdd;
      r_i += edit != kRemove;
    }

    if (!hunk.has_edits()) {
      // We are done. We don't want this hunk.
      break;
    }

    hunk.PrintTo(&ss);
  }
  return ss.str();
}